

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O3

void av1_mc_flow_dispenser_row
               (AV1_COMP *cpi,TplTxfmStats *tpl_txfm_stats,TplBuffers *tpl_tmp_buffers,MACROBLOCK *x
               ,int mi_row,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  AV1TplRowMultiThreadSync *pAVar1;
  MACROBLOCKD *xd;
  undefined1 *puVar2;
  undefined8 *puVar3;
  byte bVar4;
  byte bVar5;
  _Bool _Var6;
  uint8_t uVar7;
  undefined2 uVar8;
  int iVar9;
  int_mv iVar10;
  AV1_PRIMARY *pAVar11;
  YV12_BUFFER_CONFIG *pYVar12;
  scale_factors *scale;
  TplDepStats *pTVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  TplDepStats *pTVar16;
  undefined1 auVar17 [16];
  MACROBLOCK *pMVar18;
  tran_low_t *ptVar19;
  int16_t *piVar20;
  BitDepthInfo BVar21;
  InterpFilterParams *pIVar22;
  bool bVar23;
  int mi_ext_col;
  int iVar24;
  uint uVar25;
  int iVar26;
  int32_t iVar27;
  long diff_stride;
  MB_MODE_INFO *pMVar28;
  long lVar29;
  uint8_t *puVar30;
  search_site_config *search_sites;
  byte bVar31;
  short sVar32;
  undefined4 uVar33;
  uint uVar34;
  uint8_t *puVar35;
  int *cost_list_00;
  ulong uVar36;
  int iVar37;
  MB_MODE_INFO **ppMVar38;
  uint8_t *puVar39;
  int64_t iVar40;
  YV12_BUFFER_CONFIG *src;
  int_mv *cur_mv;
  bool bVar41;
  int iVar42;
  int iVar43;
  uint8_t *puVar44;
  SequenceHeader *pSVar45;
  PREDICTION_MODE mode_00;
  uint uVar46;
  uint8_t *puVar47;
  AV1_COMP *pAVar48;
  YV12_BUFFER_CONFIG *pYVar49;
  short sVar50;
  int iVar51;
  uint uVar52;
  long lVar53;
  uint8_t *puVar54;
  buf_2d *pbVar55;
  AV1_PRIMARY *pAVar56;
  long lVar57;
  char cVar58;
  uint uVar59;
  int iVar60;
  byte bVar61;
  uint uVar62;
  undefined7 in_register_00000089;
  byte bVar63;
  ulong uVar64;
  uint8_t *puVar65;
  uint8_t *puVar66;
  PREDICTION_MODE mode;
  FULLPEL_MV start_mv;
  uint8_t *puVar67;
  int iVar68;
  uint8_t *puVar69;
  ulong uVar70;
  MV *rfidx_mv;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  ulong uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  long lVar93;
  undefined1 in_XMM8 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  long lVar97;
  undefined1 auVar96 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  int iVar121;
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  int iVar126;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 in_XMM12 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  TX_SIZE TVar131;
  TplTxfmStats *in_stack_fffffffffffff9b8;
  int rate_cost;
  MACROBLOCK *local_638;
  byte local_629;
  scale_factors *local_628;
  AV1_COMP *local_620;
  uint8_t *local_618;
  uint8_t *local_610;
  ulong local_608;
  SequenceHeader *local_600;
  YV12_BUFFER_CONFIG *local_5f8;
  int_mv this_mv;
  uint8_t *local_5e8;
  uint8_t *local_5e0;
  ulong local_5d8;
  uint8_t *local_5d0;
  uint local_5c8;
  int local_5c4;
  int64_t recon_error;
  uint8_t *local_5b8;
  int_mv local_5b0;
  uint32_t uStack_5ac;
  undefined4 local_5a4;
  int local_5a0;
  int_mv best_rfidx_mv;
  tran_low_t *local_598;
  int16_t *local_590;
  ulong local_588;
  TplDepFrame *local_580;
  int64_t pred_error;
  MV *local_570;
  AV1_PRIMARY *local_568;
  int local_560;
  int local_55c;
  ulong local_558;
  uint8_t *local_550;
  tran_low_t *local_548;
  tran_low_t *local_540;
  ulong local_538;
  ulong local_530;
  BitDepthInfo local_528;
  ulong local_520;
  int local_514;
  uint local_510;
  int local_50c;
  MV local_508;
  int rec_stride_pool [3];
  uint8_t *local_4e8;
  center_mv_t center_mvs [4];
  long local_4b0;
  uint local_4a0;
  uint8_t *local_438;
  undefined8 local_430;
  undefined8 uStack_428;
  long local_418;
  long local_410;
  long local_408;
  long local_400;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  long local_378;
  ulong local_370;
  long local_368;
  ulong local_360;
  long local_358;
  ulong local_350;
  ulong local_348;
  TplDepFrame *local_340;
  MB_MODE_INFO_EXT *local_338;
  InterpFilterParams *local_330;
  buf_2d *local_328;
  InterpFilterParams *local_320;
  AV1_COMMON *local_318;
  uint32_t sse;
  int distortion;
  FULLPEL_MV_STATS best_mv_stats;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  TplDepStats tpl_stats;
  int cost_list [5];
  int_mv single_mv [7];
  buf_2d yv12_mb [2] [3];
  
  local_5d8 = (ulong)(uint)mi_row;
  local_5a4 = (undefined4)CONCAT71(in_register_00000089,bsize);
  local_520 = CONCAT71(in_register_00000089,bsize) & 0xffffffff;
  bVar4 = ""[local_520];
  iVar9 = (cpi->common).mi_params.mi_cols;
  bVar5 = ""[local_520];
  iVar68 = ((1 << (bVar5 & 0x1f)) >> 1) + mi_row >> (bVar5 & 0x1f);
  if (0 < iVar9) {
    pAVar11 = cpi->ppi;
    uVar62 = 4 << (bVar4 & 0x1f);
    local_558 = (ulong)uVar62;
    local_5a0 = 4 << (bVar5 & 0x1f);
    local_340 = (pAVar11->tpl_data).tpl_frame + (pAVar11->tpl_data).frame_idx;
    local_348 = 0x3efffcL >> ((byte)local_520 & 0x3f);
    local_350 = 0x20005L >> ((byte)local_520 & 0x3f);
    local_55c = local_5a0 * uVar62;
    diff_stride = (long)(int)uVar62;
    local_320 = av1_interp_filter_params_list;
    local_330 = av1_interp_filter_params_list;
    if ((int)uVar62 < 5) {
      local_330 = av1_interp_4tap;
    }
    if (local_5a0 < 5) {
      local_320 = av1_interp_4tap;
    }
    local_358 = local_558 + 7;
    local_360 = (ulong)((uint)local_358 & 0xfffffff8);
    lVar29 = local_558 - 1;
    auVar71._8_4_ = (int)lVar29;
    auVar71._0_8_ = lVar29;
    auVar71._12_4_ = (int)((ulong)lVar29 >> 0x20);
    local_368 = local_558 + 0xf;
    local_370 = (ulong)((uint)local_368 & 0xfffffff0);
    bVar5 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[local_520];
    pAVar1 = &(pAVar11->tpl_data).tpl_mt_sync;
    local_318 = &cpi->common;
    local_5c4 = mi_row * 4;
    xd = &x->e_mbd;
    local_510 = (uint)bVar5 * 4;
    local_588 = (ulong)tx_size;
    local_514 = uVar62 - 1;
    local_338 = &x->mbmi_ext;
    local_378 = local_558 * 2 + 0xe;
    local_380 = local_558 + 6;
    local_388 = local_558 * 2 + 0xc;
    local_390 = local_558 + 5;
    local_398 = local_558 * 2 + 10;
    local_3a0 = local_558 + 4;
    local_3a8 = local_558 * 2 + 8;
    local_3b0 = local_558 + 3;
    local_3b8 = local_558 * 2 + 6;
    local_3c0 = local_558 + 2;
    local_3c8 = local_558 * 2 + 4;
    local_3d0 = local_558 + 1;
    local_3d8 = local_558 * 2 + 2;
    local_3e0 = local_558 * 2;
    local_3e8 = local_558 + 0xe;
    local_3f0 = local_558 + 0xd;
    local_3f8 = local_558 + 0xc;
    local_400 = local_558 + 0xb;
    local_408 = local_558 + 10;
    local_410 = local_558 + 9;
    local_418 = local_558 + 8;
    local_328 = (x->e_mbd).plane[0].pre;
    local_560 = 0;
    local_608 = 0;
    iVar43 = 0;
    local_638 = x;
    local_629 = bVar5;
    local_620 = cpi;
    do {
      (*(cpi->mt_info).tpl_row_mt.sync_read_ptr)(pAVar1,iVar68,iVar43);
      if (1 < (cpi->mt_info).num_workers) {
        pthread_mutex_lock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
        _Var6 = (cpi->mt_info).tpl_row_mt.tpl_mt_exit;
        pthread_mutex_unlock((pthread_mutex_t *)(cpi->mt_info).tpl_row_mt.mutex_);
        if (_Var6 != false) {
          return;
        }
      }
      uVar64 = local_608;
      local_5d0 = (uint8_t *)CONCAT71(local_5d0._1_7_,(local_350 & 1) == 0);
      iVar24 = (pAVar11->tpl_data).border_in_pixels;
      iVar42 = (cpi->common).mi_params.mi_cols;
      iVar121 = (int)local_608;
      iVar37 = 8 - (iVar24 + iVar121 * 4);
      uVar62 = (uint)bVar5;
      uVar59 = iVar121 + uVar62;
      iVar51 = uVar59 * -4 + -8;
      if (iVar51 < iVar37) {
        iVar51 = iVar37;
      }
      (x->mv_limits).col_min = iVar51;
      iVar37 = iVar42 - iVar121;
      iVar51 = iVar37 * 4 + 8;
      iVar24 = iVar24 + (iVar37 - uVar62) * 4 + -8;
      if (iVar24 < iVar51) {
        iVar51 = iVar24;
      }
      (x->mv_limits).col_max = iVar51;
      (x->e_mbd).mb_to_left_edge = iVar121 * -0x20;
      iVar42 = iVar42 - uVar59;
      (x->e_mbd).mb_to_right_edge = iVar42 * 8;
      pYVar49 = (x->e_mbd).cur_buf;
      local_610 = (uint8_t *)(ulong)(uint)(x->e_mbd).bd;
      local_568 = cpi->ppi;
      local_580 = (local_568->tpl_data).tpl_frame;
      local_5e8 = (uint8_t *)((long)(local_568->tpl_data).frame_idx * 0x60);
      local_5c8 = (uint)(local_568->tpl_data).tpl_stats_block_mis_log2;
      iVar24 = (pYVar49->field_0).field_0.y_width;
      iVar51 = (pYVar49->field_4).field_0.y_stride;
      local_5f8 = (YV12_BUFFER_CONFIG *)CONCAT44(local_5f8._4_4_,iVar51);
      lVar29 = *(long *)(local_5e8 + (long)&local_580->rec_picture);
      local_5e0 = (pYVar49->field_5).buffers[0] + (iVar51 * local_5c4 + iVar121 * 4);
      rec_stride_pool[0] = *(int *)(lVar29 + 0x20);
      local_628 = (scale_factors *)(long)rec_stride_pool[0];
      puVar54 = *(uint8_t **)(lVar29 + 0x28);
      local_538 = (ulong)(uint)(cpi->sf).tpl_sf.use_y_only_rate_distortion;
      local_430 = *(undefined8 *)(lVar29 + 0x30);
      uStack_428 = *(undefined8 *)(lVar29 + 0x38);
      rec_stride_pool[1] = *(int *)(lVar29 + 0x24);
      uVar52 = (uint)pYVar49->flags >> 3 & 1;
      local_528 = (BitDepthInfo)(ulong)uVar52;
      uVar46 = pYVar49->subsampling_x;
      iVar51 = pYVar49->subsampling_y;
      local_600 = (SequenceHeader *)CONCAT44(local_600._4_4_,iVar51);
      (x->e_mbd).plane[1].subsampling_x = uVar46;
      (x->e_mbd).plane[1].subsampling_y = iVar51;
      (x->e_mbd).plane[2].subsampling_x = uVar46;
      (x->e_mbd).plane[2].subsampling_y = iVar51;
      local_550 = (uint8_t *)((ulong)tpl_tmp_buffers->predictor8 >> 1);
      if (uVar52 == 0) {
        local_550 = tpl_tmp_buffers->predictor8;
      }
      local_590 = tpl_tmp_buffers->src_diff;
      local_598 = tpl_tmp_buffers->coeff;
      local_548 = tpl_tmp_buffers->qcoeff;
      local_540 = tpl_tmp_buffers->dqcoeff;
      recon_error = 1;
      pred_error = 1;
      rec_stride_pool[2] = rec_stride_pool[1];
      local_438 = puVar54;
      memset(&tpl_stats,0,200);
      tpl_stats.ref_frame_index[0] = -1;
      tpl_stats.ref_frame_index[1] = -1;
      bVar31 = "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
               [local_520];
      iVar51 = (cpi->common).mi_params.mi_stride;
      iVar26 = (int)((long)((ulong)(uint)((int)(uint)local_5d8 >> 0x1f) << 0x20 |
                           local_5d8 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]);
      iVar37 = (int)((long)((ulong)(uint)(iVar121 >> 0x1f) << 0x20 | uVar64 & 0xffffffff) /
                    (long)(int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                     [(cpi->common).mi_params.mi_alloc_bsize]);
      iVar60 = iVar51 * (uint)local_5d8 + iVar121;
      (cpi->common).mi_params.mi_grid_base[iVar60] =
           (cpi->common).mi_params.mi_alloc +
           ((cpi->common).mi_params.mi_alloc_stride * iVar26 + iVar37);
      ppMVar38 = (cpi->common).mi_params.mi_grid_base + iVar60;
      (x->e_mbd).mi = ppMVar38;
      (x->e_mbd).tx_type_map = (cpi->common).mi_params.tx_type_map + iVar60;
      local_530 = (ulong)bVar31;
      (x->e_mbd).tx_type_map_stride = iVar51;
      x->mbmi_ext_frame =
           (cpi->mbmi_ext_info).frame_base + (iVar26 * (cpi->mbmi_ext_info).stride + iVar37);
      iVar51 = (cpi->common).mi_params.mi_rows;
      iVar37 = (x->e_mbd).tile.mi_row_start;
      iVar26 = (x->e_mbd).tile.mi_col_start;
      (x->e_mbd).mb_to_top_edge = mi_row * -0x20;
      (x->e_mbd).mb_to_bottom_edge = (iVar51 - ((uint)local_5d8 + bVar31)) * 0x20;
      (x->e_mbd).mb_to_left_edge = iVar121 * -0x20;
      (x->e_mbd).mb_to_right_edge = iVar42 * 0x20;
      (x->e_mbd).mi_row = (uint)local_5d8;
      (x->e_mbd).mi_col = iVar121;
      (x->e_mbd).left_available = iVar26 < iVar121;
      (x->e_mbd).up_available = iVar37 < (int)(uint)local_5d8;
      (x->e_mbd).chroma_up_available = iVar37 < (int)(uint)local_5d8;
      bVar23 = iVar26 < iVar121 + -1;
      if (uVar46 == 0) {
        bVar23 = iVar26 < iVar121;
      }
      if ((local_348 & 1) != 0) {
        bVar23 = iVar26 < iVar121;
      }
      (x->e_mbd).chroma_left_available = bVar23;
      uVar52 = (uint)local_5d8;
      if ((uint)local_600 != 0 && (char)local_5d0 == '\0') {
        (local_638->e_mbd).chroma_up_available = iVar37 < (int)(mi_row - 1U);
        uVar52 = mi_row - 1U;
      }
      auVar17 = _DAT_004d0ab0;
      if (iVar37 < (int)(uint)local_5d8) {
        pMVar28 = ppMVar38[-(long)(local_638->e_mbd).mi_stride];
      }
      else {
        pMVar28 = (MB_MODE_INFO *)0x0;
      }
      auVar94._8_4_ = 0xffffffff;
      auVar94._0_8_ = 0xffffffffffffffff;
      auVar94._12_4_ = 0xffffffff;
      (local_638->e_mbd).above_mbmi = pMVar28;
      uVar25 = (uint)local_608;
      if (iVar26 < (int)uVar25) {
        pMVar28 = ppMVar38[-1];
      }
      else {
        pMVar28 = (MB_MODE_INFO *)0x0;
      }
      (local_638->e_mbd).left_mbmi = pMVar28;
      if ((((local_5d8 & 1) == 0) && ((uint)local_600 != 0)) && ((bVar31 & 1) != 0)) {
        (local_638->e_mbd).is_chroma_ref = false;
      }
      else {
        if ((local_608 & 1) == 0 && (local_629 & 1) != 0) {
          (local_638->e_mbd).is_chroma_ref = uVar46 == 0;
          if (uVar46 != 0) goto LAB_00236d50;
        }
        else {
          (local_638->e_mbd).is_chroma_ref = true;
        }
        iVar42 = (local_638->e_mbd).mi_stride;
        iVar121 = (uVar46 & uVar25) + ((uint)local_600 & (uint)local_5d8) * iVar42;
        if (iVar37 < (int)uVar52) {
          pMVar28 = ppMVar38[(long)-iVar121 + (long)(int)(uVar46 - iVar42)];
        }
        else {
          pMVar28 = (MB_MODE_INFO *)0x0;
        }
        (local_638->e_mbd).chroma_above_mbmi = pMVar28;
        if (bVar23 == false) {
          pMVar28 = (MB_MODE_INFO *)0x0;
        }
        else {
          pMVar28 = ppMVar38[(long)-iVar121 + (long)(int)(iVar42 * (uint)local_600) + -1];
        }
        (local_638->e_mbd).chroma_left_mbmi = pMVar28;
      }
LAB_00236d50:
      (local_638->e_mbd).height = bVar31;
      (local_638->e_mbd).width = local_629;
      (local_638->e_mbd).is_last_vertical_rect = false;
      if ((local_629 < bVar31) && ((uVar59 & bVar31 - 1) == 0)) {
        (local_638->e_mbd).is_last_vertical_rect = true;
      }
      local_50c = uVar25 * 4;
      local_580 = (TplDepFrame *)(local_5e8 + (long)local_580);
      lVar29 = (long)(int)local_5f8;
      iVar42 = (int)local_628;
      local_528 = (BitDepthInfo)(((long)local_528 << 0x20) + (long)local_610);
      local_610 = puVar54 + (int)(iVar42 * local_5c4 + uVar25 * 4);
      (local_638->e_mbd).is_first_horizontal_rect =
           bVar31 < local_629 && (bVar5 - 1 & (uint)local_5d8) == 0;
      lVar53 = 0xa30;
      if (((local_620->common).seq_params)->monochrome == '\0') {
        lVar53 = 0x1e90;
      }
      lVar57 = 0;
      do {
        bVar61 = (byte)((uint)bVar31 * 4 >>
                       (*(byte *)((long)(local_638->e_mbd).plane[0].pre + lVar57 + -0x28) & 0x1f));
        bVar63 = (byte)(local_510 >>
                       (*(byte *)((long)(local_638->e_mbd).plane[0].pre + lVar57 + -0x2c) & 0x1f));
        if (bVar63 < 5) {
          bVar63 = 4;
        }
        *(byte *)((long)((local_638->e_mbd).plane[0].seg_iqmatrix + -1) + lVar57 + 0x90) = bVar63;
        if (bVar61 < 5) {
          bVar61 = 4;
        }
        *(byte *)((long)((local_638->e_mbd).plane[0].seg_iqmatrix + -1) + lVar57 + 0x91) = bVar61;
        lVar57 = lVar57 + 0xa30;
      } while (lVar53 != lVar57);
      pMVar28 = *ppMVar38;
      pMVar28->bsize = (BLOCK_SIZE)local_5a4;
      pMVar28->motion_mode = '\0';
      pMVar28->ref_frame[0] = '\0';
      if (((local_638->e_mbd).left_available == true) &&
         ((int)(tx_size_high_unit[local_588] + (uint)local_5d8) < (local_638->e_mbd).tile.mi_row_end
         )) {
        if ((((local_638->e_mbd).cur_buf)->flags & 8) == 0) {
          if (0 < (int)local_558) {
            puVar67 = puVar54 + local_368 * (long)local_628 + -1;
            puVar47 = puVar54 + local_3e8 * (long)local_628 + -1;
            local_5e8 = puVar54 + local_3f0 * (long)local_628 + -1;
            local_5d0 = puVar54 + local_3f8 * (long)local_628 + -1;
            local_600 = (SequenceHeader *)(puVar54 + local_400 * (long)local_628 + -1);
            local_5b8 = puVar54 + local_408 * (long)local_628 + -1;
            local_618 = puVar54 + local_410 * (long)local_628 + -1;
            local_4e8 = puVar54 + local_418 * (long)local_628 + -1;
            puVar65 = puVar54 + local_358 * (long)local_628 + -1;
            puVar44 = puVar54 + local_380 * (long)local_628 + -1;
            puVar69 = puVar54 + local_390 * (long)local_628 + -1;
            puVar30 = puVar54 + local_3a0 * (long)local_628 + -1;
            puVar35 = puVar54 + local_3b0 * (long)local_628 + -1;
            puVar39 = puVar54 + local_3c0 * (long)local_628 + -1;
            puVar66 = puVar54 + local_3d0 * (long)local_628 + -1;
            puVar54 = puVar54 + local_558 * (long)local_628 + -1;
            uVar7 = local_610[(long)(iVar42 * local_514) + -1];
            iVar42 = iVar42 * local_5c4 + local_560;
            lVar53 = (long)local_628 * 0x10;
            uVar64 = local_370;
            auVar72 = _DAT_004d0aa0;
            auVar73 = _DAT_004d0a90;
            auVar75 = _DAT_004d2680;
            auVar76 = _DAT_004d2670;
            auVar78 = _DAT_004d44c0;
            auVar80 = _DAT_004d44b0;
            auVar85 = _DAT_004d44a0;
            auVar90 = _DAT_004d4490;
            do {
              auVar94 = auVar71 ^ auVar17;
              auVar98 = auVar72 ^ auVar17;
              iVar121 = auVar94._0_4_;
              iVar60 = -(uint)(iVar121 < auVar98._0_4_);
              iVar51 = auVar94._4_4_;
              auVar100._4_4_ = -(uint)(iVar51 < auVar98._4_4_);
              iVar37 = auVar94._8_4_;
              iVar126 = -(uint)(iVar37 < auVar98._8_4_);
              iVar26 = auVar94._12_4_;
              auVar100._12_4_ = -(uint)(iVar26 < auVar98._12_4_);
              auVar112._4_4_ = iVar60;
              auVar112._0_4_ = iVar60;
              auVar112._8_4_ = iVar126;
              auVar112._12_4_ = iVar126;
              auVar94 = pshuflw(in_XMM12,auVar112,0xe8);
              auVar99._4_4_ = -(uint)(auVar98._4_4_ == iVar51);
              auVar99._12_4_ = -(uint)(auVar98._12_4_ == iVar26);
              auVar99._0_4_ = auVar99._4_4_;
              auVar99._8_4_ = auVar99._12_4_;
              auVar127 = pshuflw(in_XMM13,auVar99,0xe8);
              auVar100._0_4_ = auVar100._4_4_;
              auVar100._8_4_ = auVar100._12_4_;
              auVar98 = pshuflw(auVar94,auVar100,0xe8);
              auVar128._8_4_ = 0xffffffff;
              auVar128._0_8_ = 0xffffffffffffffff;
              auVar128._12_4_ = 0xffffffff;
              auVar94 = (auVar98 | auVar127 & auVar94) ^ auVar128;
              auVar94 = packssdw(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar54[iVar42] = uVar7;
              }
              auVar100 = auVar99 & auVar112 | auVar100;
              auVar94 = packssdw(auVar100,auVar100);
              auVar94 = packssdw(auVar94 ^ auVar128,auVar94 ^ auVar128);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._0_4_ >> 8 & 1) != 0) {
                puVar66[iVar42] = uVar7;
              }
              auVar94 = auVar73 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar94._0_4_);
              auVar122._4_4_ = -(uint)(iVar51 < auVar94._4_4_);
              iVar126 = -(uint)(iVar37 < auVar94._8_4_);
              auVar122._12_4_ = -(uint)(iVar26 < auVar94._12_4_);
              auVar101._4_4_ = iVar60;
              auVar101._0_4_ = iVar60;
              auVar101._8_4_ = iVar126;
              auVar101._12_4_ = iVar126;
              auVar113._4_4_ = -(uint)(auVar94._4_4_ == iVar51);
              auVar113._12_4_ = -(uint)(auVar94._12_4_ == iVar26);
              auVar113._0_4_ = auVar113._4_4_;
              auVar113._8_4_ = auVar113._12_4_;
              auVar122._0_4_ = auVar122._4_4_;
              auVar122._8_4_ = auVar122._12_4_;
              auVar94 = auVar113 & auVar101 | auVar122;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packssdw(auVar94 ^ auVar128,auVar94 ^ auVar128);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._0_4_ >> 0x10 & 1) != 0) {
                puVar39[iVar42] = uVar7;
              }
              auVar98 = pshufhw(auVar101,auVar101,0x84);
              auVar114 = pshufhw(auVar113,auVar113,0x84);
              auVar127 = pshufhw(auVar98,auVar122,0x84);
              auVar98 = (auVar127 | auVar114 & auVar98) ^ auVar128;
              auVar98 = packssdw(auVar98,auVar98);
              auVar98 = packsswb(auVar98,auVar98);
              if ((auVar98._0_4_ >> 0x18 & 1) != 0) {
                puVar35[iVar42] = uVar7;
              }
              auVar98 = auVar75 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar98._0_4_);
              auVar103._4_4_ = -(uint)(iVar51 < auVar98._4_4_);
              iVar126 = -(uint)(iVar37 < auVar98._8_4_);
              auVar103._12_4_ = -(uint)(iVar26 < auVar98._12_4_);
              auVar115._4_4_ = iVar60;
              auVar115._0_4_ = iVar60;
              auVar115._8_4_ = iVar126;
              auVar115._12_4_ = iVar126;
              auVar94 = pshuflw(auVar94,auVar115,0xe8);
              auVar102._4_4_ = -(uint)(auVar98._4_4_ == iVar51);
              auVar102._12_4_ = -(uint)(auVar98._12_4_ == iVar26);
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar127 = pshuflw(auVar128,auVar102,0xe8);
              auVar103._0_4_ = auVar103._4_4_;
              auVar103._8_4_ = auVar103._12_4_;
              auVar98 = pshuflw(auVar94,auVar103,0xe8);
              auVar129._8_4_ = 0xffffffff;
              auVar129._0_8_ = 0xffffffffffffffff;
              auVar129._12_4_ = 0xffffffff;
              auVar94 = (auVar98 | auVar127 & auVar94) ^ auVar129;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar30[iVar42] = uVar7;
              }
              auVar103 = auVar102 & auVar115 | auVar103;
              auVar94 = packssdw(auVar103,auVar103);
              auVar94 = packssdw(auVar94 ^ auVar129,auVar94 ^ auVar129);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._4_2_ >> 8 & 1) != 0) {
                puVar69[iVar42] = uVar7;
              }
              auVar94 = auVar76 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar94._0_4_);
              auVar123._4_4_ = -(uint)(iVar51 < auVar94._4_4_);
              iVar126 = -(uint)(iVar37 < auVar94._8_4_);
              auVar123._12_4_ = -(uint)(iVar26 < auVar94._12_4_);
              auVar104._4_4_ = iVar60;
              auVar104._0_4_ = iVar60;
              auVar104._8_4_ = iVar126;
              auVar104._12_4_ = iVar126;
              auVar116._4_4_ = -(uint)(auVar94._4_4_ == iVar51);
              auVar116._12_4_ = -(uint)(auVar94._12_4_ == iVar26);
              auVar116._0_4_ = auVar116._4_4_;
              auVar116._8_4_ = auVar116._12_4_;
              auVar123._0_4_ = auVar123._4_4_;
              auVar123._8_4_ = auVar123._12_4_;
              auVar94 = auVar116 & auVar104 | auVar123;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packssdw(auVar94 ^ auVar129,auVar94 ^ auVar129);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar44[iVar42] = uVar7;
              }
              auVar98 = pshufhw(auVar104,auVar104,0x84);
              auVar114 = pshufhw(auVar116,auVar116,0x84);
              auVar127 = pshufhw(auVar98,auVar123,0x84);
              auVar98 = (auVar127 | auVar114 & auVar98) ^ auVar129;
              auVar98 = packssdw(auVar98,auVar98);
              auVar98 = packsswb(auVar98,auVar98);
              if ((auVar98._6_2_ >> 8 & 1) != 0) {
                puVar65[iVar42] = uVar7;
              }
              auVar98 = auVar78 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar98._0_4_);
              auVar106._4_4_ = -(uint)(iVar51 < auVar98._4_4_);
              iVar126 = -(uint)(iVar37 < auVar98._8_4_);
              auVar106._12_4_ = -(uint)(iVar26 < auVar98._12_4_);
              auVar117._4_4_ = iVar60;
              auVar117._0_4_ = iVar60;
              auVar117._8_4_ = iVar126;
              auVar117._12_4_ = iVar126;
              auVar94 = pshuflw(auVar94,auVar117,0xe8);
              auVar105._4_4_ = -(uint)(auVar98._4_4_ == iVar51);
              auVar105._12_4_ = -(uint)(auVar98._12_4_ == iVar26);
              auVar105._0_4_ = auVar105._4_4_;
              auVar105._8_4_ = auVar105._12_4_;
              auVar127 = pshuflw(auVar129,auVar105,0xe8);
              auVar106._0_4_ = auVar106._4_4_;
              auVar106._8_4_ = auVar106._12_4_;
              auVar98 = pshuflw(auVar94,auVar106,0xe8);
              auVar130._8_4_ = 0xffffffff;
              auVar130._0_8_ = 0xffffffffffffffff;
              auVar130._12_4_ = 0xffffffff;
              auVar94 = (auVar98 | auVar127 & auVar94) ^ auVar130;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                local_4e8[iVar42] = uVar7;
              }
              auVar106 = auVar105 & auVar117 | auVar106;
              auVar94 = packssdw(auVar106,auVar106);
              auVar94 = packssdw(auVar94 ^ auVar130,auVar94 ^ auVar130);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._8_2_ >> 8 & 1) != 0) {
                local_618[iVar42] = uVar7;
              }
              auVar94 = auVar80 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar94._0_4_);
              auVar124._4_4_ = -(uint)(iVar51 < auVar94._4_4_);
              iVar126 = -(uint)(iVar37 < auVar94._8_4_);
              auVar124._12_4_ = -(uint)(iVar26 < auVar94._12_4_);
              auVar107._4_4_ = iVar60;
              auVar107._0_4_ = iVar60;
              auVar107._8_4_ = iVar126;
              auVar107._12_4_ = iVar126;
              auVar118._4_4_ = -(uint)(auVar94._4_4_ == iVar51);
              auVar118._12_4_ = -(uint)(auVar94._12_4_ == iVar26);
              auVar118._0_4_ = auVar118._4_4_;
              auVar118._8_4_ = auVar118._12_4_;
              auVar124._0_4_ = auVar124._4_4_;
              auVar124._8_4_ = auVar124._12_4_;
              auVar94 = auVar118 & auVar107 | auVar124;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packssdw(auVar94 ^ auVar130,auVar94 ^ auVar130);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                local_5b8[iVar42] = uVar7;
              }
              auVar98 = pshufhw(auVar107,auVar107,0x84);
              auVar114 = pshufhw(auVar118,auVar118,0x84);
              auVar127 = pshufhw(auVar98,auVar124,0x84);
              auVar98 = (auVar127 | auVar114 & auVar98) ^ auVar130;
              auVar98 = packssdw(auVar98,auVar98);
              auVar98 = packsswb(auVar98,auVar98);
              if ((auVar98._10_2_ >> 8 & 1) != 0) {
                *(uint8_t *)((long)local_600 + (long)iVar42) = uVar7;
              }
              auVar98 = auVar85 ^ auVar17;
              iVar60 = -(uint)(iVar121 < auVar98._0_4_);
              auVar109._4_4_ = -(uint)(iVar51 < auVar98._4_4_);
              iVar126 = -(uint)(iVar37 < auVar98._8_4_);
              auVar109._12_4_ = -(uint)(iVar26 < auVar98._12_4_);
              auVar119._4_4_ = iVar60;
              auVar119._0_4_ = iVar60;
              auVar119._8_4_ = iVar126;
              auVar119._12_4_ = iVar126;
              auVar94 = pshuflw(auVar94,auVar119,0xe8);
              auVar108._4_4_ = -(uint)(auVar98._4_4_ == iVar51);
              auVar108._12_4_ = -(uint)(auVar98._12_4_ == iVar26);
              auVar108._0_4_ = auVar108._4_4_;
              auVar108._8_4_ = auVar108._12_4_;
              auVar127 = pshuflw(auVar130,auVar108,0xe8);
              auVar109._0_4_ = auVar109._4_4_;
              auVar109._8_4_ = auVar109._12_4_;
              auVar98 = pshuflw(auVar94,auVar109,0xe8);
              in_XMM13._8_4_ = 0xffffffff;
              in_XMM13._0_8_ = 0xffffffffffffffff;
              in_XMM13._12_4_ = 0xffffffff;
              auVar94 = (auVar98 | auVar127 & auVar94) ^ in_XMM13;
              auVar94 = packssdw(auVar94,auVar94);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                local_5d0[iVar42] = uVar7;
              }
              auVar109 = auVar108 & auVar119 | auVar109;
              auVar94 = packssdw(auVar109,auVar109);
              auVar94 = packssdw(auVar94 ^ in_XMM13,auVar94 ^ in_XMM13);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._12_2_ >> 8 & 1) != 0) {
                local_5e8[iVar42] = uVar7;
              }
              auVar94 = auVar90 ^ auVar17;
              auVar125._0_4_ = -(uint)(iVar121 < auVar94._0_4_);
              auVar125._4_4_ = -(uint)(iVar51 < auVar94._4_4_);
              auVar125._8_4_ = -(uint)(iVar37 < auVar94._8_4_);
              auVar125._12_4_ = -(uint)(iVar26 < auVar94._12_4_);
              auVar110._4_4_ = auVar125._0_4_;
              auVar110._0_4_ = auVar125._0_4_;
              auVar110._8_4_ = auVar125._8_4_;
              auVar110._12_4_ = auVar125._8_4_;
              iVar121 = -(uint)(auVar94._4_4_ == iVar51);
              iVar51 = -(uint)(auVar94._12_4_ == iVar26);
              auVar95._4_4_ = iVar121;
              auVar95._0_4_ = iVar121;
              auVar95._8_4_ = iVar51;
              auVar95._12_4_ = iVar51;
              auVar120._4_4_ = auVar125._4_4_;
              auVar120._0_4_ = auVar125._4_4_;
              auVar120._8_4_ = auVar125._12_4_;
              auVar120._12_4_ = auVar125._12_4_;
              in_XMM12 = auVar95 & auVar110 | auVar120;
              auVar94 = packssdw(auVar125,in_XMM12);
              auVar94 = packssdw(auVar94 ^ in_XMM13,auVar94 ^ in_XMM13);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar47[iVar42] = uVar7;
              }
              auVar98 = pshufhw(auVar110,auVar110,0x84);
              auVar94 = pshufhw(auVar95,auVar95,0x84);
              auVar127 = pshufhw(auVar98,auVar120,0x84);
              in_XMM9 = (auVar127 | auVar94 & auVar98) ^ in_XMM13;
              auVar94 = packssdw(auVar94 & auVar98,in_XMM9);
              auVar94 = packsswb(auVar94,auVar94);
              if ((auVar94._14_2_ >> 8 & 1) != 0) {
                puVar67[iVar42] = uVar7;
              }
              lVar57 = auVar72._8_8_;
              lVar93 = (long)DAT_0050b790;
              auVar72._0_8_ = auVar72._0_8_ + lVar93;
              lVar97 = DAT_0050b790._8_8_;
              auVar72._8_8_ = lVar57 + lVar97;
              lVar57 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + lVar93;
              auVar73._8_8_ = lVar57 + lVar97;
              lVar57 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + lVar93;
              auVar75._8_8_ = lVar57 + lVar97;
              lVar57 = auVar76._8_8_;
              auVar76._0_8_ = auVar76._0_8_ + lVar93;
              auVar76._8_8_ = lVar57 + lVar97;
              lVar57 = auVar78._8_8_;
              auVar78._0_8_ = auVar78._0_8_ + lVar93;
              auVar78._8_8_ = lVar57 + lVar97;
              lVar57 = auVar80._8_8_;
              auVar80._0_8_ = auVar80._0_8_ + lVar93;
              auVar80._8_8_ = lVar57 + lVar97;
              lVar57 = auVar85._8_8_;
              auVar85._0_8_ = auVar85._0_8_ + lVar93;
              auVar85._8_8_ = lVar57 + lVar97;
              lVar57 = auVar90._8_8_;
              auVar90._0_8_ = auVar90._0_8_ + lVar93;
              auVar90._8_8_ = lVar57 + lVar97;
              puVar67 = puVar67 + lVar53;
              puVar47 = puVar47 + lVar53;
              local_5e8 = local_5e8 + lVar53;
              local_5d0 = local_5d0 + lVar53;
              local_600 = (SequenceHeader *)((long)local_600 + lVar53);
              local_5b8 = local_5b8 + lVar53;
              local_618 = local_618 + lVar53;
              local_4e8 = local_4e8 + lVar53;
              puVar65 = puVar65 + lVar53;
              puVar44 = puVar44 + lVar53;
              puVar69 = puVar69 + lVar53;
              puVar30 = puVar30 + lVar53;
              puVar35 = puVar35 + lVar53;
              puVar39 = puVar39 + lVar53;
              puVar66 = puVar66 + lVar53;
              puVar54 = puVar54 + lVar53;
              uVar64 = uVar64 - 0x10;
              in_XMM8 = _DAT_0050b790;
            } while (uVar64 != 0);
          }
        }
        else if (0 < (int)local_558) {
          lVar53 = (long)local_610 * 2;
          uVar8 = *(undefined2 *)(lVar53 + -2 + (long)(iVar42 * local_514) * 2);
          uVar64 = local_360;
          auVar98 = _DAT_004d0aa0;
          auVar127 = _DAT_004d0a90;
          auVar114 = _DAT_004d2680;
          auVar77 = _DAT_004d2670;
          do {
            auVar79 = auVar71 ^ auVar17;
            auVar81 = auVar98 ^ auVar17;
            iVar42 = auVar79._0_4_;
            iVar26 = -(uint)(iVar42 < auVar81._0_4_);
            iVar121 = auVar79._4_4_;
            auVar82._4_4_ = -(uint)(iVar121 < auVar81._4_4_);
            iVar51 = auVar79._8_4_;
            iVar60 = -(uint)(iVar51 < auVar81._8_4_);
            iVar37 = auVar79._12_4_;
            auVar82._12_4_ = -(uint)(iVar37 < auVar81._12_4_);
            auVar87._4_4_ = iVar26;
            auVar87._0_4_ = iVar26;
            auVar87._8_4_ = iVar60;
            auVar87._12_4_ = iVar60;
            auVar96 = pshuflw(in_XMM8,auVar87,0xe8);
            auVar79._4_4_ = -(uint)(auVar81._4_4_ == iVar121);
            auVar79._12_4_ = -(uint)(auVar81._12_4_ == iVar37);
            auVar79._0_4_ = auVar79._4_4_;
            auVar79._8_4_ = auVar79._12_4_;
            auVar111 = pshuflw(in_XMM9,auVar79,0xe8);
            auVar82._0_4_ = auVar82._4_4_;
            auVar82._8_4_ = auVar82._12_4_;
            auVar81 = pshuflw(auVar96,auVar82,0xe8);
            auVar81 = (auVar81 | auVar111 & auVar96) ^ auVar94;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_3e0 * (long)local_628) = uVar8;
            }
            auVar82 = auVar79 & auVar87 | auVar82;
            auVar79 = packssdw(auVar82,auVar82);
            auVar79 = packssdw(auVar79 ^ auVar94,auVar79 ^ auVar94);
            if ((auVar79._0_4_ >> 0x10 & 1) != 0) {
              *(undefined2 *)(lVar53 + -2 + local_3d8 * (long)local_628) = uVar8;
            }
            auVar79 = auVar127 ^ auVar17;
            iVar26 = -(uint)(iVar42 < auVar79._0_4_);
            auVar91._4_4_ = -(uint)(iVar121 < auVar79._4_4_);
            iVar60 = -(uint)(iVar51 < auVar79._8_4_);
            auVar91._12_4_ = -(uint)(iVar37 < auVar79._12_4_);
            auVar81._4_4_ = iVar26;
            auVar81._0_4_ = iVar26;
            auVar81._8_4_ = iVar60;
            auVar81._12_4_ = iVar60;
            auVar86._4_4_ = -(uint)(auVar79._4_4_ == iVar121);
            auVar86._12_4_ = -(uint)(auVar79._12_4_ == iVar37);
            auVar86._0_4_ = auVar86._4_4_;
            auVar86._8_4_ = auVar86._12_4_;
            auVar91._0_4_ = auVar91._4_4_;
            auVar91._8_4_ = auVar91._12_4_;
            auVar79 = auVar86 & auVar81 | auVar91;
            auVar79 = packssdw(auVar79,auVar79);
            auVar79 = packssdw(auVar79 ^ auVar94,auVar79 ^ auVar94);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_3c8 * (long)local_628) = uVar8;
            }
            auVar81 = pshufhw(auVar81,auVar81,0x84);
            auVar87 = pshufhw(auVar86,auVar86,0x84);
            auVar82 = pshufhw(auVar81,auVar91,0x84);
            auVar81 = (auVar82 | auVar87 & auVar81) ^ auVar94;
            auVar81 = packssdw(auVar81,auVar81);
            if ((auVar81 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_3b8 * (long)local_628) = uVar8;
            }
            auVar81 = auVar114 ^ auVar17;
            iVar26 = -(uint)(iVar42 < auVar81._0_4_);
            auVar84._4_4_ = -(uint)(iVar121 < auVar81._4_4_);
            iVar60 = -(uint)(iVar51 < auVar81._8_4_);
            auVar84._12_4_ = -(uint)(iVar37 < auVar81._12_4_);
            auVar88._4_4_ = iVar26;
            auVar88._0_4_ = iVar26;
            auVar88._8_4_ = iVar60;
            auVar88._12_4_ = iVar60;
            auVar79 = pshuflw(auVar79,auVar88,0xe8);
            auVar83._4_4_ = -(uint)(auVar81._4_4_ == iVar121);
            auVar83._12_4_ = -(uint)(auVar81._12_4_ == iVar37);
            auVar83._0_4_ = auVar83._4_4_;
            auVar83._8_4_ = auVar83._12_4_;
            in_XMM9 = pshuflw(auVar111 & auVar96,auVar83,0xe8);
            in_XMM9 = in_XMM9 & auVar79;
            auVar84._0_4_ = auVar84._4_4_;
            auVar84._8_4_ = auVar84._12_4_;
            auVar79 = pshuflw(auVar79,auVar84,0xe8);
            auVar79 = (auVar79 | in_XMM9) ^ auVar94;
            auVar79 = packssdw(auVar79,auVar79);
            if ((auVar79 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_3a8 * (long)local_628) = uVar8;
            }
            auVar84 = auVar83 & auVar88 | auVar84;
            auVar79 = packssdw(auVar84,auVar84);
            auVar79 = packssdw(auVar79 ^ auVar94,auVar79 ^ auVar94);
            if ((auVar79 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_398 * (long)local_628) = uVar8;
            }
            auVar79 = auVar77 ^ auVar17;
            auVar92._0_4_ = -(uint)(iVar42 < auVar79._0_4_);
            auVar92._4_4_ = -(uint)(iVar121 < auVar79._4_4_);
            auVar92._8_4_ = -(uint)(iVar51 < auVar79._8_4_);
            auVar92._12_4_ = -(uint)(iVar37 < auVar79._12_4_);
            auVar111._4_4_ = auVar92._0_4_;
            auVar111._0_4_ = auVar92._0_4_;
            auVar111._8_4_ = auVar92._8_4_;
            auVar111._12_4_ = auVar92._8_4_;
            iVar42 = -(uint)(auVar79._4_4_ == iVar121);
            iVar121 = -(uint)(auVar79._12_4_ == iVar37);
            auVar96._4_4_ = iVar42;
            auVar96._0_4_ = iVar42;
            auVar96._8_4_ = iVar121;
            auVar96._12_4_ = iVar121;
            auVar89._4_4_ = auVar92._4_4_;
            auVar89._0_4_ = auVar92._4_4_;
            auVar89._8_4_ = auVar92._12_4_;
            auVar89._12_4_ = auVar92._12_4_;
            in_XMM8 = auVar96 & auVar111 | auVar89;
            auVar79 = packssdw(auVar92,in_XMM8);
            auVar79 = packssdw(auVar79 ^ auVar94,auVar79 ^ auVar94);
            if ((auVar79 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_388 * (long)local_628) = uVar8;
            }
            auVar81 = pshufhw(auVar111,auVar111,0x84);
            auVar79 = pshufhw(auVar96,auVar96,0x84);
            auVar82 = pshufhw(auVar81,auVar89,0x84);
            auVar79 = packssdw(auVar79 & auVar81,(auVar82 | auVar79 & auVar81) ^ auVar94);
            if ((auVar79 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
              *(undefined2 *)(lVar53 + -2 + local_378 * (long)local_628) = uVar8;
            }
            lVar57 = auVar98._8_8_;
            auVar98._0_8_ = auVar98._0_8_ + 8;
            auVar98._8_8_ = lVar57 + 8;
            lVar57 = auVar127._8_8_;
            auVar127._0_8_ = auVar127._0_8_ + 8;
            auVar127._8_8_ = lVar57 + 8;
            lVar57 = auVar114._8_8_;
            auVar114._0_8_ = auVar114._0_8_ + 8;
            auVar114._8_8_ = lVar57 + 8;
            lVar57 = auVar77._8_8_;
            auVar77._0_8_ = auVar77._0_8_ + 8;
            auVar77._8_8_ = lVar57 + 8;
            lVar53 = lVar53 + (long)local_628 * 0x10;
            uVar64 = uVar64 - 8;
          } while (uVar64 != 0);
        }
      }
      local_600 = (local_620->common).seq_params;
      uVar33 = 3;
      if ((local_620->sf).tpl_sf.prune_intra_modes == 0) {
        uVar33 = 0xd;
      }
      local_618 = (uint8_t *)CONCAT44(local_618._4_4_,uVar33);
      local_5e8 = (uint8_t *)CONCAT44(local_5e8._4_4_,(uint)block_size_wide[local_520]);
      local_5d0 = (uint8_t *)CONCAT44(local_5d0._4_4_,(uint)block_size_high[local_520]);
      local_5b8 = (uint8_t *)CONCAT44(local_5b8._4_4_,0x7fffffff);
      uVar52 = 0;
      uVar46 = 0;
      puVar54 = local_550;
      do {
        TVar131 = (TX_SIZE)local_588;
        iVar42 = (int)local_558;
        av1_predict_intra_block
                  (xd,local_600->sb_size,(uint)local_600->enable_intra_edge_filter,(int)local_5e8,
                   (int)local_5d0,TVar131,(PREDICTION_MODE)uVar52,0,0,'\x05',local_610,
                   (int)local_628,puVar54,iVar42,0,0,0);
        BVar21 = local_528;
        piVar20 = local_590;
        if (*(int *)((long)local_580 + 0x5c) == 0) {
          av1_subtract_block(local_528,local_5a0,iVar42,local_590,diff_stride,local_5e0,lVar29,
                             local_550,diff_stride);
          puVar54 = local_550;
          ptVar19 = local_598;
          av1_quick_txfm(0,TVar131,BVar21,piVar20,iVar42,local_598);
          uVar25 = (*aom_satd)(ptVar19,local_55c);
        }
        else {
          uVar25 = (*local_620->ppi->fn_ptr[local_520].sdf)(local_5e0,(int)local_5f8,puVar54,iVar42)
          ;
        }
        puVar30 = local_550;
        uVar34 = (uint)local_5b8;
        uVar46 = uVar46 & 0xff;
        if ((int)uVar25 < (int)(uint)local_5b8) {
          uVar34 = uVar25;
          uVar46 = uVar52;
        }
        mode_00 = (PREDICTION_MODE)uVar46;
        local_5b8 = (uint8_t *)CONCAT44(local_5b8._4_4_,uVar34);
        uVar52 = uVar52 + 1;
      } while ((uint)local_618 != uVar52);
      if (*(int *)((long)local_580 + 0x5c) != 0) {
        TVar131 = (TX_SIZE)local_588;
        iVar42 = (int)local_558;
        av1_predict_intra_block
                  (xd,local_600->sb_size,(uint)local_600->enable_intra_edge_filter,(int)local_5e8,
                   (int)local_5d0,TVar131,mode_00,0,0,'\x05',local_610,(int)local_628,local_550,
                   iVar42,0,0,0);
        BVar21 = local_528;
        piVar20 = local_590;
        av1_subtract_block(local_528,local_5a0,iVar42,local_590,diff_stride,local_5e0,lVar29,puVar30
                           ,diff_stride);
        ptVar19 = local_598;
        av1_quick_txfm(0,TVar131,BVar21,piVar20,iVar42,local_598);
        iVar42 = (*aom_satd)(ptVar19,local_55c);
        local_5b8 = (uint8_t *)CONCAT44(local_5b8._4_4_,iVar42);
      }
      uVar70 = local_588;
      uVar64 = local_5d8;
      pAVar48 = local_620;
      x = local_638;
      rate_cost = 1;
      iVar42 = (int)local_5d8;
      iVar121 = (int)local_608;
      if (local_620->use_ducky_encode == 0) {
        iVar40 = 1;
        local_4b0 = 1;
      }
      else {
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_590,local_598,local_548,
                            local_540,(AV1_COMMON *)(local_620->common).seq_params,local_638,
                            (YV12_BUFFER_CONFIG **)0x0,&local_438,rec_stride_pool,(TX_SIZE)local_588
                            ,mode_00,iVar42,iVar121,(int)local_538,1,in_stack_fffffffffffff9b8);
        local_4b0 = recon_error;
        tpl_stats.intra_dist = recon_error << 4;
        tpl_stats.intra_sse = pred_error << 4;
        tpl_stats.intra_rate = rate_cost;
        iVar40 = pred_error;
      }
      (*(x->e_mbd).mi)->ref_frame[0] = '\0';
      (*(x->e_mbd).mi)->ref_frame[1] = -1;
      puVar2 = &(*(x->e_mbd).mi)->field_0xa7;
      *(ushort *)puVar2 = *(ushort *)puVar2 | 0x200;
      bVar31 = (byte)local_5c8;
      local_5c8 = iVar42 - (int)local_530 >> (bVar31 & 0x1f);
      local_4a0 = (uint)bVar5;
      local_5b0 = (int_mv)0x80008000;
      uStack_5ac = -0x7fff8000;
      local_618 = (uint8_t *)CONCAT44(local_618._4_4_,0x7fffffff);
      local_570 = (MV *)0xffffffff;
      rfidx_mv = (MV *)0x0;
      pAVar56 = local_568;
      do {
        puVar54 = local_5e0;
        single_mv[(long)rfidx_mv].as_int = 0x80008000;
        if (((pAVar56->tpl_data).ref_frame[(long)rfidx_mv] == (YV12_BUFFER_CONFIG *)0x0) ||
           (pYVar49 = (pAVar56->tpl_data).src_ref_frame[(long)rfidx_mv],
           pYVar49 == (YV12_BUFFER_CONFIG *)0x0)) {
          tpl_stats.mv[(long)rfidx_mv].as_int = 0x80008000;
        }
        else {
          local_5d0 = (uint8_t *)CONCAT44(local_5d0._4_4_,(pYVar49->field_0).field_0.y_width);
          iVar51 = (pYVar49->field_4).field_0.y_stride;
          local_610 = (uint8_t *)CONCAT44(local_610._4_4_,iVar51);
          puVar30 = (pYVar49->field_5).buffers[0] + (iVar51 * local_5c4 + local_50c);
          best_rfidx_mv.as_int = 0;
          center_mvs[2].mv = (int_mv)0x0;
          center_mvs[2].sad = 0x7fffffff;
          center_mvs[3].mv = (int_mv)0x0;
          center_mvs[3].sad = 0x7fffffff;
          center_mvs[0].mv = (int_mv)0x0;
          center_mvs[0].sad = 0x7fffffff;
          center_mvs[1].mv = (int_mv)0x0;
          center_mvs[1].sad = 0x7fffffff;
          cVar58 = (x->e_mbd).up_available;
          uVar46 = 1;
          if ((_Bool)cVar58 == true) {
            iVar10 = (int_mv)*(int_mv *)
                              &((int_mv *)
                               ((long)(int)(*(int *)((long)local_580 + 0x40) * local_5c8 +
                                           (iVar121 >> (bVar31 & 0x1f))) * 200 +
                                *(long *)((long)local_580 + 8) + 0xa4 + (long)rfidx_mv * 4))->as_mv;
            iVar37 = (int)iVar10.as_int >> 0x10;
            iVar51 = -iVar37;
            if (0 < iVar37) {
              iVar51 = iVar37;
            }
            if (iVar51 < (int)*(uint *)(&DAT_0050ba88 +
                                       (long)(local_620->sf).tpl_sf.skip_alike_starting_mv * 4)) {
              uVar25 = (uint)iVar10.as_mv.row;
              uVar52 = -uVar25;
              if (0 < (int)uVar25) {
                uVar52 = uVar25;
              }
              if (uVar52 < *(uint *)(&DAT_0050ba88 +
                                    (long)(local_620->sf).tpl_sf.skip_alike_starting_mv * 4))
              goto LAB_00237ecc;
            }
            center_mvs[1].sad = 0x7fffffff;
            center_mvs[1].mv._0_2_ = iVar10._0_2_;
            center_mvs[1].mv._2_2_ = iVar10._2_2_;
            uVar46 = 2;
          }
LAB_00237ecc:
          if ((x->e_mbd).left_available == true) {
            local_628 = (scale_factors *)CONCAT71(local_628._1_7_,cVar58);
            iVar10 = *(int_mv *)
                      ((long)(*(int *)((long)local_580 + 0x40) * (iVar42 >> (bVar31 & 0x1f)) +
                             ((int)(iVar121 - local_4a0) >> (bVar31 & 0x1f))) * 200 +
                       *(long *)((long)local_580 + 8) + 0xa4 + (long)rfidx_mv * 4);
            iVar51 = is_alike_mv(iVar10,center_mvs,uVar46,
                                 (local_620->sf).tpl_sf.skip_alike_starting_mv);
            if (iVar51 == 0) {
              center_mvs[uVar46].mv = iVar10;
              uVar46 = uVar46 + 1;
            }
            cVar58 = (char)local_628;
          }
          pAVar48 = local_620;
          local_5e8 = puVar30;
          if ((cVar58 != '\0') && ((int)uVar59 < (x->e_mbd).tile.mi_col_end)) {
            iVar10 = *(int_mv *)
                      ((long)(int)(*(int *)((long)local_580 + 0x40) * local_5c8 +
                                  ((int)uVar59 >> (bVar31 & 0x1f))) * 200 +
                       *(long *)((long)local_580 + 8) + 0xa4 + (long)rfidx_mv * 4);
            local_628 = (scale_factors *)CONCAT44(local_628._4_4_,iVar10.as_int);
            iVar51 = is_alike_mv(iVar10,center_mvs,uVar46,
                                 (local_620->sf).tpl_sf.skip_alike_starting_mv);
            if (iVar51 == 0) {
              center_mvs[uVar46].mv.as_int = (uint32_t)local_628;
              uVar46 = uVar46 + 1;
            }
          }
          uVar64 = local_520;
          puVar30 = local_5e8;
          local_628 = (scale_factors *)(ulong)(BLOCK_SIZE)local_5a4;
          if (uVar46 < 2 || (pAVar48->sf).tpl_sf.prune_starting_mv == 0) {
LAB_00238133:
            local_600 = (SequenceHeader *)(ulong)uVar46;
            uVar46 = 0xffffffff;
            pSVar45 = (SequenceHeader *)0x0;
            do {
              local_508 = center_mvs[(long)pSVar45].mv.as_mv;
              start_mv = (FULLPEL_MV)
                         ((int)local_508.row + (uint)(-1 < local_508.row) + 3 >> 3 & 0xffff |
                         (((int)local_508 >> 0x10) - ((int)~(uint)local_508 >> 0x1f)) * 0x2000 +
                         0x6000U & 0xffff0000);
              local_638->plane[0].src.buf = puVar54;
              local_638->plane[0].src.stride = (int)local_5f8;
              local_638->plane[0].src.width = iVar24;
              (local_638->e_mbd).plane[0].pre[0].buf = local_5e8;
              (local_638->e_mbd).plane[0].pre[0].stride = (uint)local_610;
              (local_638->e_mbd).plane[0].pre[0].width = (int)local_5d0;
              iVar51 = (pAVar48->sf).tpl_sf.reduce_first_step_size;
              if (8 < iVar51) {
                iVar51 = 9;
              }
              search_sites = (pAVar48->mv_search_params).search_site_cfg[1];
              if ((pAVar48->mv_search_params).search_site_cfg[0][0].stride == (uint)local_610) {
                search_sites = (pAVar48->mv_search_params).search_site_cfg[0];
              }
              av1_make_default_fullpel_ms_params
                        (&full_ms_params,pAVar48,local_638,(BLOCK_SIZE)local_628,&local_508,start_mv
                         ,search_sites,(pAVar48->sf).tpl_sf.search_method,0);
              if ((pAVar48->sf).mv_sf.subpel_search_method == '\0') {
                cost_list_00 = (int *)0x0;
              }
              else {
                cost_list_00 = cost_list;
                if ((pAVar48->sf).mv_sf.use_fullpel_costlist == 0) {
                  cost_list_00 = (int *)0x0;
                }
              }
              uVar52 = av1_full_pixel_search
                                 (start_mv,&full_ms_params,iVar51,cost_list_00,&this_mv.as_fullmv,
                                  &best_mv_stats,(FULLPEL_MV *)0x0);
              if ((pAVar48->sf).tpl_sf.subpel_force_stop == '\x03') {
                this_mv.as_int = (this_mv.as_int >> 0x10) * 0x80000 + (this_mv.as_int & 0x1fff) * 8;
              }
              else {
                av1_make_default_subpel_ms_params
                          ((SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,pAVar48,local_638,
                           (BLOCK_SIZE)local_628,&local_508,cost_list);
                yv12_mb[0][0].width._0_1_ = (pAVar48->sf).tpl_sf.subpel_force_stop;
                yv12_mb[1][0].buf._0_1_ = 1;
                yv12_mb[0][1].height._0_1_ = 4;
                best_mv_stats.err_cost = 0;
                uVar52 = (*(pAVar48->mv_search_params).find_fractional_mv_step)
                                   (xd,local_318,(SUBPEL_MOTION_SEARCH_PARAMS *)yv12_mb,
                                    (MV)((this_mv.as_int >> 0x10) * 0x80000 +
                                        (this_mv.as_int & 0x1fff) * 8),&best_mv_stats,(MV *)&this_mv
                                    ,&distortion,&sse,(int_mv *)0x0);
              }
              if (uVar52 < uVar46) {
                best_rfidx_mv = this_mv;
                uVar46 = uVar52;
              }
              pSVar45 = (SequenceHeader *)((long)&pSVar45->num_bits_width + 1);
              puVar54 = local_5e0;
            } while (local_600 != pSVar45);
          }
          else {
            local_600 = (SequenceHeader *)(ulong)uVar46;
            pSVar45 = (SequenceHeader *)0x0;
            iVar51 = (uint)local_610;
            do {
              uVar52 = (uint)center_mvs[(long)pSVar45].mv.as_mv.row;
              uVar25 = (uint)center_mvs[(long)pSVar45].mv.as_mv.col;
              iVar60 = (int)((uVar25 - ((int)~uVar25 >> 0x1f)) + 3) >> 3;
              iVar37 = (x->mv_limits).col_min;
              iVar26 = (x->mv_limits).col_max;
              if (iVar60 < iVar26) {
                iVar26 = iVar60;
              }
              sVar50 = (short)iVar26;
              if (iVar60 < iVar37) {
                sVar50 = (short)iVar37;
              }
              iVar26 = (int)((uVar52 - ((int)~uVar52 >> 0x1f)) + 3) >> 3;
              iVar37 = (x->mv_limits).row_max;
              if (iVar26 < iVar37) {
                iVar37 = iVar26;
              }
              sVar32 = (short)iVar37;
              iVar37 = (x->mv_limits).row_min;
              if (iVar26 < iVar37) {
                sVar32 = (short)iVar37;
              }
              uVar52 = (*local_620->ppi->fn_ptr[uVar64].sdf)
                                 (puVar54,(int)local_5f8,puVar30 + ((int)sVar50 + sVar32 * iVar51),
                                  iVar51);
              center_mvs[(long)pSVar45].sad = uVar52;
              pSVar45 = (SequenceHeader *)((long)&pSVar45->num_bits_width + 1);
            } while (local_600 != pSVar45);
            qsort(center_mvs,(size_t)local_600,8,compare_sad);
            uVar52 = 4 - (local_620->sf).tpl_sf.prune_starting_mv;
            if ((int)uVar46 <= (int)uVar52) {
              uVar52 = uVar46;
            }
            pAVar48 = local_620;
            if (1 < (int)uVar52) {
              uVar46 = uVar52;
              if (center_mvs[uVar52 - 2].sad <
                  (center_mvs[uVar52 - 1].sad - center_mvs[uVar52 - 2].sad) * 5) {
                uVar46 = uVar52 - 1;
              }
              goto LAB_00238133;
            }
            uVar46 = 1;
            if (uVar52 == 1) goto LAB_00238133;
          }
          uVar70 = local_588;
          uVar64 = local_5d8;
          x = local_638;
          tpl_stats.mv[(long)rfidx_mv] = best_rfidx_mv;
          single_mv[(long)rfidx_mv] = best_rfidx_mv;
          uVar46 = get_inter_cost(pAVar48,(MACROBLOCKD *)
                                          (ulong)(uint)((local_638->e_mbd).cur_buf)->flags,
                                  (uint8_t *)(ulong)(uint)(local_638->e_mbd).bd,(int)puVar54,
                                  (TplBuffers *)((ulong)local_5f8 & 0xffffffff),
                                  (BLOCK_SIZE)tpl_tmp_buffers,(TX_SIZE)local_628,(int)local_588,
                                  (int)local_5d8,(int)local_608,rfidx_mv,(int)&best_rfidx_mv);
          uVar36 = 1;
          if (1 < (int)uVar46) {
            uVar36 = (ulong)uVar46;
          }
          tpl_stats.pred_error[(long)rfidx_mv] = uVar36;
          pAVar56 = local_568;
          if ((int)uVar46 < (int)(uint)local_618) {
            local_5b0.as_int = best_rfidx_mv.as_int;
            local_618 = (uint8_t *)CONCAT44(local_618._4_4_,uVar46);
            local_570 = (MV *)((ulong)rfidx_mv & 0xffffffff);
          }
        }
        iVar51 = (int)uVar64;
        rfidx_mv = (MV *)((long)&rfidx_mv->row + 1);
      } while (rfidx_mv != (MV *)0x7);
      if ((uint)local_618 == 0x7fffffff) {
        local_618 = (uint8_t *)CONCAT44(local_618._4_4_,0x7fffffff);
      }
      else {
        if (*(int *)((long)local_580 + 0x5c) != 0) {
          iVar27 = get_inter_cost(pAVar48,(MACROBLOCKD *)(ulong)(uint)((x->e_mbd).cur_buf)->flags,
                                  (uint8_t *)(ulong)(uint)(x->e_mbd).bd,(int)local_5e0,
                                  (TplBuffers *)((ulong)local_5f8 & 0xffffffff),
                                  (BLOCK_SIZE)tpl_tmp_buffers,(BLOCK_SIZE)local_5a4,(int)uVar70,
                                  iVar51,(int)local_608,local_570,(int)&local_5b0);
          local_618 = (uint8_t *)CONCAT44(local_618._4_4_,iVar27);
          pAVar56 = local_568;
        }
        if ((int)local_570 != -1) {
          if ((int)(uint)local_618 < (int)(uint)local_5b8) {
            (*(x->e_mbd).mi)->ref_frame[0] = (char)local_570 + '\x01';
            (*(x->e_mbd).mi)->mv[0].as_int = (uint32_t)local_5b0;
            mode_00 = '\x10';
          }
        }
      }
      iVar24 = (pAVar48->sf).tpl_sf.allow_compound_pred;
      (x->e_mbd).mi_row = iVar51;
      (x->e_mbd).mi_col = (int)local_608;
      if (iVar24 == 0) {
        uVar46 = 0xffffffff;
LAB_00238a47:
        TVar131 = (TX_SIZE)uVar70;
        rate_cost = 0;
        if (((uint)local_618 != 0x7fffffff) && (0xf3 < (byte)(mode_00 - 0x19))) goto LAB_00238a7a;
      }
      else {
        local_628 = &(pAVar56->tpl_data).sf;
        uVar46 = 0xffffffff;
        puVar54 = (uint8_t *)0x0;
        do {
          iVar24 = (&DAT_0050ba10)[(long)puVar54 * 2];
          if (((pAVar56->tpl_data).ref_frame[iVar24] != (YV12_BUFFER_CONFIG *)0x0) &&
             (pYVar49 = (pAVar56->tpl_data).src_ref_frame[iVar24],
             pYVar49 != (YV12_BUFFER_CONFIG *)0x0)) {
            iVar42 = (&DAT_0050ba14)[(long)puVar54 * 2];
            if (((pAVar56->tpl_data).ref_frame[iVar42] != (YV12_BUFFER_CONFIG *)0x0) &&
               (pYVar12 = (pAVar56->tpl_data).src_ref_frame[iVar42], x = local_638,
               pYVar12 != (YV12_BUFFER_CONFIG *)0x0)) {
              local_610 = (uint8_t *)CONCAT44(local_610._4_4_,uVar46);
              (*(local_638->e_mbd).mi)->ref_frame[0] = (char)iVar24 + '\x01';
              (*(local_638->e_mbd).mi)->ref_frame[1] = (char)iVar42 + '\x01';
              ppMVar38 = (local_638->e_mbd).mi;
              pMVar28 = *ppMVar38;
              pMVar28->mode = '\x18';
              cVar58 = pMVar28->ref_frame[0];
              bVar31 = pMVar28->ref_frame[1];
              if ('\0' < (char)bVar31) {
                if (bVar31 < 5 || '\x04' < cVar58) {
                  lVar53 = 0;
                  do {
                    if ((cVar58 == (&comp_ref0_lut)[lVar53]) && (bVar31 == (&comp_ref1_lut)[lVar53])
                       ) {
                      cVar58 = (char)lVar53 + '\x14';
                      goto LAB_00238663;
                    }
                    lVar53 = lVar53 + 1;
                  } while (lVar53 != 9);
                }
                cVar58 = bVar31 * '\x04' + cVar58 + -0xd;
              }
LAB_00238663:
              local_5d0 = (uint8_t *)CONCAT44(local_5d0._4_4_,single_mv[iVar24].as_int);
              *(uint32_t *)
               ((long)&local_338->ref_mv_stack[cVar58][0].this_mv +
               (ulong)(*(ushort *)&pMVar28->field_0xa7 >> 1 & 0x18)) = single_mv[iVar24].as_int;
              local_600 = (SequenceHeader *)CONCAT44(local_600._4_4_,single_mv[iVar42].as_int);
              *(uint32_t *)
               ((long)&local_338->ref_mv_stack[cVar58][0].comp_mv +
               (ulong)(*(ushort *)&(*ppMVar38)->field_0xa7 >> 1 & 0x18)) = single_mv[iVar42].as_int;
              lVar53 = 0;
              src = pYVar49;
              pbVar55 = yv12_mb[0];
              bVar23 = true;
              local_5f8 = pYVar12;
              local_5e8 = puVar54;
              do {
                bVar41 = bVar23;
                scale = (local_638->e_mbd).block_ref_scale_factors[lVar53];
                av1_setup_pred_block(xd,pbVar55,src,scale,scale,3);
                pMVar18 = local_638;
                pbVar55 = local_328 + lVar53;
                lVar57 = 0;
                do {
                  puVar3 = (undefined8 *)((long)&yv12_mb[lVar53][0].buf + lVar57);
                  puVar54 = (uint8_t *)*puVar3;
                  puVar30 = (uint8_t *)puVar3[1];
                  puVar3 = (undefined8 *)((long)&yv12_mb[lVar53][0].width + lVar57);
                  uVar14 = *puVar3;
                  uVar15 = puVar3[1];
                  pbVar55->width = (int)uVar14;
                  pbVar55->height = (int)((ulong)uVar14 >> 0x20);
                  *(undefined8 *)&pbVar55->stride = uVar15;
                  pbVar55->buf = puVar54;
                  pbVar55->buf0 = puVar30;
                  lVar57 = lVar57 + 0x20;
                  pbVar55 = (buf_2d *)((long)(pbVar55 + 0x51) + 0x10);
                } while (lVar57 != 0x60);
                lVar53 = 1;
                iVar24 = 0;
                src = local_5f8;
                pbVar55 = yv12_mb[1];
                bVar23 = false;
              } while (bVar41);
              center_mvs[0].sad = (uint)local_600;
              center_mvs[0].mv.as_int = (uint32_t)local_5d0;
              cur_mv = &center_mvs[0].mv;
              av1_joint_motion_search
                        (local_620,local_638,(BLOCK_SIZE)local_5a4,cur_mv,(uint8_t *)0x0,0,cost_list
                         ,(uint)((local_620->sf).mv_sf.disable_second_mv == 0),2);
              pIVar22 = local_330;
              uVar64 = local_558;
              bVar23 = true;
              do {
                bVar41 = bVar23;
                full_ms_params._136_8_ = (pYVar49->field_5).field_0.y_buffer;
                full_ms_params.fast_obmc_search = (pYVar49->field_0).field_0.y_width;
                full_ms_params._148_4_ = (pYVar49->field_1).field_0.y_height;
                full_ms_params.mv_cost_params.ref_mv._0_4_ = (pYVar49->field_4).field_0.y_stride;
                full_ms_params.mv_cost_params.mvcost[0]._0_4_ = (pMVar18->e_mbd).bd;
                full_ms_params.mv_cost_params.mvcost[0]._4_4_ =
                     (uint)((pMVar18->e_mbd).cur_buf)->flags >> 3 & 1;
                iVar42 = (int)uVar64;
                full_ms_params.force_mesh_thresh = local_5a0;
                full_ms_params.mesh_patterns[0]._0_4_ = local_5c4;
                full_ms_params.mesh_patterns[0]._4_4_ = local_50c;
                full_ms_params.mv_cost_params.full_ref_mv.row = 0;
                full_ms_params.mv_cost_params.full_ref_mv.col = 0;
                full_ms_params.mv_cost_params.mv_cost_type = '\0';
                full_ms_params.mv_cost_params._13_3_ = 0;
                full_ms_params.sdf._4_4_ = 0;
                full_ms_params.sdx4df = (aom_sad_multi_d_fn_t)0xfffb9000fffb9000;
                full_ms_params.mv_limits._8_8_ = pIVar22;
                full_ms_params._104_8_ = local_320;
                full_ms_params.mv_cost_params.mvjcost = &local_628->x_scale_fp;
                full_ms_params.mesh_patterns[1] = (MESH_PATTERN *)0x0;
                full_ms_params.bsize = BLOCK_4X4;
                full_ms_params._1_7_ = 0x1000000;
                full_ms_params.ms_buffers.wsrc = (int32_t *)(pMVar18->e_mbd).tmp_conv_dst;
                full_ms_params.ms_buffers.obmc_mask._4_4_ =
                     (int)full_ms_params.mv_cost_params.mvcost[0] + -7;
                if ((int)full_ms_params.mv_cost_params.mvcost[0] < 0xb) {
                  full_ms_params.ms_buffers.obmc_mask._4_4_ = 3;
                }
                full_ms_params.ms_buffers.obmc_mask._0_4_ = 0x80;
                full_ms_params.search_method = '\a';
                full_ms_params._73_7_ = 0;
                full_ms_params.search_sites = (search_site_config *)0x1;
                full_ms_params.ms_buffers.mask_stride = iVar24;
                full_ms_params.mesh_search_mv_diff_threshold = iVar42;
                av1_enc_build_one_inter_predictor
                          (local_550,iVar42,&cur_mv->as_mv,(InterPredParams *)&full_ms_params);
                BVar21 = local_528;
                piVar20 = local_590;
                iVar24 = 1;
                cur_mv = (int_mv *)&center_mvs[0].sad;
                pYVar49 = local_5f8;
                bVar23 = false;
              } while (bVar41);
              av1_subtract_block(local_528,local_5a0,iVar42,local_590,diff_stride,local_5e0,lVar29,
                                 local_550,diff_stride);
              uVar70 = local_588;
              ptVar19 = local_598;
              av1_quick_txfm(0,(TX_SIZE)local_588,BVar21,piVar20,iVar42,local_598);
              iVar24 = (*aom_satd)(ptVar19,local_55c);
              uVar64 = local_5d8;
              pAVar56 = local_568;
              puVar54 = local_5e8;
              x = local_638;
              uVar46 = (uint)local_610;
              if (iVar24 < (int)(uint)local_618) {
                _local_5b0 = center_mvs[0];
                local_618 = (uint8_t *)CONCAT44(local_618._4_4_,iVar24);
                uVar46 = (uint)local_5e8;
              }
            }
          }
          iVar51 = (int)uVar64;
          TVar131 = (TX_SIZE)uVar70;
          puVar54 = puVar54 + 1;
        } while (puVar54 != (uint8_t *)0x3);
        if (uVar46 == 0xffffffff) goto LAB_00238a47;
        if ((int)(uint)local_5b8 <= (int)(uint)local_618) goto LAB_00238a47;
        cVar58 = *(char *)(&DAT_0050ba14 + (long)(int)uVar46 * 2);
        (*(x->e_mbd).mi)->ref_frame[0] = *(char *)(&DAT_0050ba10 + (long)(int)uVar46 * 2) + '\x01';
        (*(x->e_mbd).mi)->ref_frame[1] = cVar58 + '\x01';
        mode_00 = '\x18';
LAB_00238a7a:
        (*(x->e_mbd).mi)->mv[0].as_int = (uint32_t)local_5b0;
        (*(x->e_mbd).mi)->mv[1].as_int = uStack_5ac;
        local_610 = (uint8_t *)CONCAT44(local_610._4_4_,uVar46);
        if ((int)uVar46 < 0) {
          iVar24 = (int)local_570;
          full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
        }
        else {
          iVar24 = (&DAT_0050ba10)[(ulong)uVar46 * 2];
          full_ms_params.vfp =
               (aom_variance_fn_ptr_t *)
               (pAVar56->tpl_data).src_ref_frame[(int)(&DAT_0050ba14)[(ulong)uVar46 * 2]];
        }
        full_ms_params._0_8_ = (pAVar56->tpl_data).src_ref_frame[iVar24];
        rate_cost = 1;
        get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_590,local_598,local_548,
                            local_540,(AV1_COMMON *)(local_620->common).seq_params,x,
                            (YV12_BUFFER_CONFIG **)&full_ms_params,&local_438,rec_stride_pool,
                            TVar131,mode_00,iVar51,(int)local_608,(int)local_538,0,
                            in_stack_fffffffffffff9b8);
        tpl_stats.srcrf_rate = rate_cost;
        iVar40 = pred_error;
        pAVar56 = local_568;
        local_4b0 = recon_error;
        uVar46 = (uint)local_610;
      }
      local_5f8 = (YV12_BUFFER_CONFIG *)CONCAT44(local_5f8._4_4_,rate_cost);
      tpl_stats.intra_cost = (uint)local_5b8;
      if ((int)(uint)local_5b8 < 2) {
        tpl_stats.intra_cost = 1;
      }
      tpl_stats.inter_cost = (uint)local_618;
      if (tpl_stats.intra_cost < (int)(uint)local_618) {
        tpl_stats.inter_cost = tpl_stats.intra_cost;
      }
      local_4b0 = local_4b0 * 0x10;
      tpl_stats.srcrf_sse = iVar40 << 4;
      rate_cost = 0;
      local_610 = (uint8_t *)CONCAT44(local_610._4_4_,uVar46);
      if (mode_00 == '\x18') {
        full_ms_params._0_8_ =
             (pAVar56->tpl_data).ref_frame[(int)(&DAT_0050ba10)[(long)(int)uVar46 * 2]];
        full_ms_params.vfp =
             (aom_variance_fn_ptr_t *)
             (pAVar56->tpl_data).ref_frame[(int)(&DAT_0050ba14)[(long)(int)uVar46 * 2]];
      }
      else {
        if ((int)local_570 < 0) {
          full_ms_params._0_8_ = (YV12_BUFFER_CONFIG *)0x0;
        }
        else {
          full_ms_params._0_8_ = (pAVar56->tpl_data).ref_frame[(ulong)local_570 & 0xffffffff];
        }
        full_ms_params.vfp = (aom_variance_fn_ptr_t *)0x0;
      }
      tpl_stats.srcrf_dist = local_4b0;
      get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_590,local_598,local_548,
                          local_540,(AV1_COMMON *)(local_620->common).seq_params,x,
                          (YV12_BUFFER_CONFIG **)&full_ms_params,&local_438,rec_stride_pool,TVar131,
                          mode_00,iVar51,(int)local_608,(int)local_538,1,in_stack_fffffffffffff9b8);
      pAVar56 = local_568;
      tpl_stats.recrf_dist = recon_error * 0x10;
      tpl_stats.recrf_sse = pred_error << 4;
      if ((byte)(mode_00 - 0x19) < 0xf4) {
        tpl_stats.srcrf_rate = rate_cost;
        tpl_stats.recrf_rate = rate_cost;
        tpl_stats.srcrf_sse = tpl_stats.recrf_sse;
        tpl_stats.srcrf_dist = tpl_stats.recrf_dist;
      }
      else {
        lVar29 = tpl_stats.recrf_dist;
        if (tpl_stats.recrf_dist < local_4b0) {
          lVar29 = local_4b0;
        }
        iVar24 = rate_cost;
        if (rate_cost < (int)local_5f8) {
          iVar24 = (int)local_5f8;
        }
        tpl_stats.recrf_dist = lVar29;
        tpl_stats.recrf_rate = iVar24;
        if (mode_00 == '\x18') {
          local_5e0 = (uint8_t *)(long)(int)(&DAT_0050ba10)[(long)(int)(uint)local_610 * 2];
          full_ms_params._0_8_ = (local_568->tpl_data).ref_frame[(long)local_5e0];
          local_628 = (scale_factors *)(long)(int)(&DAT_0050ba14)[(long)(int)(uint)local_610 * 2];
          full_ms_params.vfp =
               (aom_variance_fn_ptr_t *)(local_568->tpl_data).src_ref_frame[(long)local_628];
          TVar131 = (TX_SIZE)local_588;
          iVar42 = (int)local_5d8;
          get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_590,local_598,local_548,
                              local_540,(AV1_COMMON *)(local_620->common).seq_params,local_638,
                              (YV12_BUFFER_CONFIG **)&full_ms_params,&local_438,rec_stride_pool,
                              TVar131,'\x18',iVar42,(int)local_608,(int)local_538,1,
                              in_stack_fffffffffffff9b8);
          x = local_638;
          tpl_stats.cmp_recrf_dist[0] = recon_error * 0x10;
          if (recon_error * 0x10 < local_4b0) {
            tpl_stats.cmp_recrf_dist[0] = local_4b0;
          }
          if (rate_cost < (int)local_5f8) {
            rate_cost = (int)local_5f8;
          }
          if (lVar29 < tpl_stats.cmp_recrf_dist[0]) {
            tpl_stats.cmp_recrf_dist[0] = lVar29;
          }
          tpl_stats.cmp_recrf_rate[0] = rate_cost;
          if (iVar24 < rate_cost) {
            tpl_stats.cmp_recrf_rate[0] = iVar24;
          }
          rate_cost = 0;
          full_ms_params._0_8_ = (pAVar56->tpl_data).src_ref_frame[(long)local_5e0];
          full_ms_params.vfp =
               (aom_variance_fn_ptr_t *)(pAVar56->tpl_data).ref_frame[(long)local_628];
          get_rate_distortion(&rate_cost,&recon_error,&pred_error,local_590,local_598,local_548,
                              local_540,(AV1_COMMON *)(local_620->common).seq_params,local_638,
                              (YV12_BUFFER_CONFIG **)&full_ms_params,&local_438,rec_stride_pool,
                              TVar131,'\x18',iVar42,(int)local_608,(int)local_538,1,
                              in_stack_fffffffffffff9b8);
          tpl_stats.cmp_recrf_dist[1] = recon_error * 0x10;
          if (recon_error * 0x10 < local_4b0) {
            tpl_stats.cmp_recrf_dist[1] = local_4b0;
          }
          tpl_stats.cmp_recrf_rate[1] = rate_cost;
          if (rate_cost < (int)local_5f8) {
            tpl_stats.cmp_recrf_rate[1] = (int)local_5f8;
          }
          if (lVar29 < tpl_stats.cmp_recrf_dist[1]) {
            tpl_stats.cmp_recrf_dist[1] = lVar29;
          }
          if (iVar24 < tpl_stats.cmp_recrf_rate[1]) {
            tpl_stats.cmp_recrf_rate[1] = iVar24;
          }
          tpl_stats.ref_frame_index[1] = (int8_t)local_628;
          tpl_stats.ref_frame_index[0] = (char)local_5e0;
          tpl_stats.mv[(char)local_5e0].as_int = (uint32_t)local_5b0;
          tpl_stats.mv[tpl_stats.ref_frame_index[1]].as_int = uStack_5ac;
        }
        else if (mode_00 == '\x10') {
          tpl_stats.mv[(int)local_570].as_int = (uint32_t)local_5b0;
          tpl_stats.ref_frame_index[1] = -1;
          tpl_stats.ref_frame_index[0] = (int8_t)local_570;
        }
      }
      cpi = local_620;
      iVar121 = (int)local_530;
      iVar24 = (x->e_mbd).mb_to_right_edge;
      iVar42 = 0;
      do {
        lVar29 = 0;
        do {
          if (((int)lVar29 < (int)((iVar24 >> 5) + uVar62)) &&
             (iVar42 - iVar121 < (x->e_mbd).mb_to_bottom_edge >> 5)) {
            ppMVar38 = (x->e_mbd).mi;
            ppMVar38[(long)iVar42 * (long)(local_620->common).mi_params.mi_stride + lVar29] =
                 *ppMVar38;
          }
          lVar29 = lVar29 + 1;
        } while ((uint)bVar5 + (uint)(bVar5 == 0) != (int)lVar29);
        iVar42 = iVar42 + 1;
      } while (iVar42 != iVar121 + (uint)(iVar121 == 0));
      bVar31 = (pAVar11->tpl_data).tpl_stats_block_mis_log2;
      pTVar13 = local_340->tpl_stats_ptr;
      iVar24 = ((int)local_608 >> (bVar31 & 0x1f)) +
               ((int)local_5d8 >> (bVar31 & 0x1f)) * local_340->stride;
      memcpy(pTVar13 + iVar24,&tpl_stats,200);
      uVar64._0_4_ = pTVar13[iVar24].intra_cost;
      uVar64._4_4_ = pTVar13[iVar24].inter_cost;
      iVar42 = (int)DAT_005071f0;
      iVar121 = DAT_005071f0._4_4_;
      uVar70 = CONCAT44(-(uint)(iVar121 < (int)uVar64._4_4_),
                        -(uint)(iVar42 < (int)(undefined4)uVar64));
      uVar36 = (ulong)DAT_005071f0;
      uVar64 = ~uVar70 & uVar36 | uVar64 & uVar70;
      uVar70._0_4_ = pTVar13[iVar24].srcrf_rate;
      uVar70._4_4_ = pTVar13[iVar24].recrf_rate;
      uVar74 = CONCAT44(-(uint)(iVar121 < (int)uVar70._4_4_),
                        -(uint)(iVar42 < (int)(undefined4)uVar70));
      pTVar16 = pTVar13 + iVar24;
      pTVar16->intra_cost = (int)uVar64;
      pTVar16->inter_cost = (int)(uVar64 >> 0x20);
      *(ulong *)(&pTVar16->intra_cost + 2) = ~uVar74 & uVar36 | uVar70 & uVar74;
      lVar29 = pTVar13[iVar24].srcrf_dist;
      if (lVar29 < 2) {
        lVar29 = 1;
      }
      lVar53 = pTVar13[iVar24].srcrf_sse;
      if (lVar53 < 2) {
        lVar53 = 1;
      }
      pTVar13[iVar24].srcrf_dist = lVar29;
      pTVar13[iVar24].srcrf_sse = lVar53;
      lVar29 = pTVar13[iVar24].recrf_dist;
      if (lVar29 < 2) {
        lVar29 = 1;
      }
      pTVar13[iVar24].recrf_dist = lVar29;
      lVar29 = pTVar13[iVar24].cmp_recrf_dist[0];
      if (lVar29 < 2) {
        lVar29 = 1;
      }
      pTVar13[iVar24].cmp_recrf_dist[0] = lVar29;
      lVar29 = pTVar13[iVar24].cmp_recrf_dist[1];
      if (lVar29 < 2) {
        lVar29 = 1;
      }
      pTVar13[iVar24].cmp_recrf_dist[1] = lVar29;
      uVar64 = *(ulong *)pTVar13[iVar24].cmp_recrf_rate;
      uVar70 = CONCAT44(-(uint)(iVar121 < (int)(uVar64 >> 0x20)),-(uint)(iVar42 < (int)uVar64));
      *(ulong *)pTVar13[iVar24].cmp_recrf_rate = ~uVar70 & uVar36 | uVar64 & uVar70;
      (*(cpi->mt_info).tpl_row_mt.sync_write_ptr)
                (pAVar1,iVar68,iVar43,((1 << (bVar4 & 0x1f)) >> 1) + iVar9 >> (bVar4 & 0x1f));
      iVar43 = iVar43 + 1;
      local_560 = local_560 + local_510;
      local_608 = (ulong)uVar59;
    } while ((int)uVar59 < (cpi->common).mi_params.mi_cols);
  }
  return;
}

Assistant:

void av1_mc_flow_dispenser_row(AV1_COMP *cpi, TplTxfmStats *tpl_txfm_stats,
                               TplBuffers *tpl_tmp_buffers, MACROBLOCK *x,
                               int mi_row, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  AV1_COMMON *const cm = &cpi->common;
  MultiThreadInfo *const mt_info = &cpi->mt_info;
  AV1TplRowMultiThreadInfo *const tpl_row_mt = &mt_info->tpl_row_mt;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  const int mi_width = mi_size_wide[bsize];
  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_data->frame_idx];
  MACROBLOCKD *xd = &x->e_mbd;

  const int tplb_cols_in_tile =
      ROUND_POWER_OF_TWO(mi_params->mi_cols, mi_size_wide_log2[bsize]);
  const int tplb_row = ROUND_POWER_OF_TWO(mi_row, mi_size_high_log2[bsize]);
  assert(mi_size_high[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));
  assert(mi_size_wide[bsize] == (1 << tpl_data->tpl_stats_block_mis_log2));

  for (int mi_col = 0, tplb_col_in_tile = 0; mi_col < mi_params->mi_cols;
       mi_col += mi_width, tplb_col_in_tile++) {
    (*tpl_row_mt->sync_read_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                 tplb_col_in_tile);

#if CONFIG_MULTITHREAD
    if (mt_info->num_workers > 1) {
      pthread_mutex_lock(tpl_row_mt->mutex_);
      const bool tpl_mt_exit = tpl_row_mt->tpl_mt_exit;
      pthread_mutex_unlock(tpl_row_mt->mutex_);
      // Exit in case any worker has encountered an error.
      if (tpl_mt_exit) return;
    }
#endif

    TplDepStats tpl_stats;

    // Motion estimation column boundary
    av1_set_mv_col_limits(mi_params, &x->mv_limits, mi_col, mi_width,
                          tpl_data->border_in_pixels);
    xd->mb_to_left_edge = -GET_MV_SUBPEL(mi_col * MI_SIZE);
    xd->mb_to_right_edge =
        GET_MV_SUBPEL(mi_params->mi_cols - mi_width - mi_col);
    mode_estimation(cpi, tpl_txfm_stats, tpl_tmp_buffers, x, mi_row, mi_col,
                    bsize, tx_size, &tpl_stats);

    // Motion flow dependency dispenser.
    tpl_model_store(tpl_frame->tpl_stats_ptr, mi_row, mi_col, tpl_frame->stride,
                    &tpl_stats, tpl_data->tpl_stats_block_mis_log2);
    (*tpl_row_mt->sync_write_ptr)(&tpl_data->tpl_mt_sync, tplb_row,
                                  tplb_col_in_tile, tplb_cols_in_tile);
  }
}